

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void init_fields(void)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  ostream *poVar5;
  reference pvVar6;
  pointer psVar7;
  undefined8 in_XMM4_Qb;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar29;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM5_Qb;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  int jj_1;
  string f_reflection3_1;
  string f_reflection2_1;
  string f_reflection1_1;
  string lp_reflection3_1;
  string lp_reflection2_1;
  string lp_reflection1_1;
  int f_len_1;
  char *tmpf_1;
  int lp_len_1;
  char *tmpl_1;
  double beta;
  double alpha;
  int jj;
  string f_reflection3;
  string f_reflection2;
  string f_reflection1;
  string lp_reflection3;
  string lp_reflection2;
  string lp_reflection1;
  int f_len;
  char *tmpf;
  int lp_len;
  char *tmpl;
  int i;
  char *in_stack_fffffffffffff028;
  char *pcVar181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar182;
  double in_stack_fffffffffffff050;
  double in_stack_fffffffffffff058;
  spatial_region *in_stack_fffffffffffff060;
  double dVar183;
  undefined8 in_stack_fffffffffffff390;
  double dVar184;
  undefined1 append;
  double in_stack_fffffffffffff398;
  double dVar185;
  double in_stack_fffffffffffff3a0;
  double x1;
  undefined1 in_stack_fffffffffffff3ab;
  int in_stack_fffffffffffff3ac;
  int sscos;
  double in_stack_fffffffffffff3b0;
  undefined7 in_stack_fffffffffffff3b8;
  undefined1 in_stack_fffffffffffff3bf;
  double in_stack_fffffffffffff3c0;
  undefined6 in_stack_fffffffffffff3c8;
  undefined1 in_stack_fffffffffffff3ce;
  undefined1 in_stack_fffffffffffff3cf;
  double in_stack_fffffffffffff3d0;
  double dVar186;
  double in_stack_fffffffffffff3d8;
  double dVar187;
  spatial_region *in_stack_fffffffffffff3e0;
  spatial_region *this;
  double in_stack_fffffffffffff3f0;
  double in_stack_fffffffffffff3f8;
  undefined4 in_stack_fffffffffffff400;
  undefined4 in_stack_fffffffffffff404;
  undefined4 uVar188;
  double in_stack_fffffffffffff408;
  undefined7 in_stack_fffffffffffff410;
  undefined1 in_stack_fffffffffffff417;
  double in_stack_fffffffffffff418;
  int in_stack_fffffffffffff610;
  undefined4 in_stack_fffffffffffff614;
  double in_stack_fffffffffffff618;
  undefined7 in_stack_fffffffffffff620;
  undefined1 in_stack_fffffffffffff627;
  undefined8 in_stack_fffffffffffff628;
  undefined6 in_stack_fffffffffffff630;
  undefined1 in_stack_fffffffffffff636;
  undefined1 in_stack_fffffffffffff637;
  double in_stack_fffffffffffff638;
  double in_stack_fffffffffffff640;
  double in_stack_fffffffffffff648;
  double in_stack_fffffffffffff650;
  double in_stack_fffffffffffff658;
  spatial_region *in_stack_fffffffffffff660;
  double in_stack_fffffffffffff670;
  double in_stack_fffffffffffff678;
  double in_stack_fffffffffffff680;
  double in_stack_fffffffffffff688;
  double in_stack_fffffffffffff690;
  double in_stack_fffffffffffff698;
  int local_248;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [36];
  int local_154;
  long local_150;
  int local_144;
  long local_140;
  double local_138;
  double local_130;
  int local_128;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_4 = mpi_rank;
  bVar1 = std::operator==(in_stack_fffffffffffff030,in_stack_fffffffffffff028);
  if (bVar1) {
    local_10 = std::__cxx11::string::c_str();
    local_14 = std::__cxx11::string::size();
    local_20 = std::__cxx11::string::c_str();
    local_24 = std::__cxx11::string::size();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"",&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"",&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"",&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"",&local_f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"",&local_121);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    local_128 = 0;
    while( true ) {
      bVar1 = false;
      if (local_128 < local_14) {
        bVar1 = *(char *)(local_10 + local_128) != '&';
      }
      if (!bVar1) break;
      std::__cxx11::string::operator+=(local_48,*(char *)(local_10 + local_128));
      local_128 = local_128 + 1;
    }
    local_128 = local_128 + 1;
    if (local_128 < local_14) {
      while( true ) {
        bVar1 = false;
        if (local_128 < local_14) {
          bVar1 = *(char *)(local_10 + local_128) != '&';
        }
        if (!bVar1) break;
        std::__cxx11::string::operator+=(local_80,*(char *)(local_10 + local_128));
        local_128 = local_128 + 1;
      }
    }
    local_128 = local_128 + 1;
    if (local_128 < local_14) {
      while( true ) {
        bVar1 = false;
        if (local_128 < local_14) {
          bVar1 = *(char *)(local_10 + local_128) != '&';
        }
        if (!bVar1) break;
        std::__cxx11::string::operator+=(local_a8,*(char *)(local_10 + local_128));
        local_128 = local_128 + 1;
      }
    }
    local_128 = 0;
    while( true ) {
      bVar1 = false;
      if (local_128 < local_24) {
        bVar1 = *(char *)(local_20 + local_128) != '&';
      }
      if (!bVar1) break;
      std::__cxx11::string::operator+=(local_d0,*(char *)(local_20 + local_128));
      local_128 = local_128 + 1;
    }
    local_128 = local_128 + 1;
    if (local_128 < local_24) {
      while( true ) {
        bVar1 = false;
        if (local_128 < local_24) {
          bVar1 = *(char *)(local_20 + local_128) != '&';
        }
        if (!bVar1) break;
        std::__cxx11::string::operator+=(local_f8,*(char *)(local_20 + local_128));
        local_128 = local_128 + 1;
      }
    }
    uVar3 = (undefined1)((ulong)in_stack_fffffffffffff628 >> 0x38);
    uVar2 = (undefined1)((uint)in_stack_fffffffffffff614 >> 0x18);
    local_128 = local_128 + 1;
    if (local_128 < local_24) {
      while( true ) {
        uVar3 = (undefined1)((ulong)in_stack_fffffffffffff628 >> 0x38);
        uVar2 = (undefined1)((uint)in_stack_fffffffffffff614 >> 0x18);
        bVar1 = false;
        if (local_128 < local_24) {
          bVar1 = *(char *)(local_20 + local_128) != '&';
        }
        if (!bVar1) break;
        std::__cxx11::string::operator+=(local_120,*(char *)(local_20 + local_128));
        local_128 = local_128 + 1;
      }
    }
    if ((shenergy != 0.0) || (NAN(shenergy))) {
      local_130 = sqrt(1.0 - shenergy);
      local_138 = sqrt(shenergy);
      std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x140993);
      dVar186 = dx;
      dVar183 = xlength * 0.5 + x0;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = dVar183;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar186;
      auVar9._0_8_ = (double)*pvVar6;
      auVar9._8_8_ = in_XMM4_Qb;
      auVar9 = vfnmadd213sd_fma(auVar9,auVar31,auVar72);
      uVar29 = auVar9._8_8_;
      spatial_region::f_init_focused
                (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
                 in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                 (double)CONCAT17(in_stack_fffffffffffff637,
                                  CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
                 (bool)uVar3,(double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                 in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                 in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680,
                 in_stack_fffffffffffff688,in_stack_fffffffffffff690,in_stack_fffffffffffff698);
      std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x140b0e);
      dVar186 = dx;
      dVar183 = xlength * 0.5 + x0;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = dVar183;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar186;
      auVar10._0_8_ = (double)*pvVar6;
      auVar10._8_8_ = uVar29;
      auVar9 = vfnmadd213sd_fma(auVar10,auVar32,auVar73);
      uVar29 = auVar9._8_8_;
      pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pcVar181 = (char *)z00;
      spatial_region::f_init_focused
                (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
                 in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                 (double)CONCAT17(in_stack_fffffffffffff637,
                                  CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
                 (bool)uVar3,(double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                 in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                 in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680,
                 in_stack_fffffffffffff688,in_stack_fffffffffffff690,in_stack_fffffffffffff698);
    }
    else {
      std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x1407ec);
      dVar186 = dx;
      dVar183 = xlength * 0.5 + x0;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = dVar183;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar186;
      auVar8._0_8_ = (double)*pvVar6;
      auVar8._8_8_ = in_XMM4_Qb;
      auVar9 = vfnmadd213sd_fma(auVar8,auVar30,auVar71);
      uVar29 = auVar9._8_8_;
      pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pcVar181 = (char *)z00;
      spatial_region::f_init_focused
                (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
                 in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                 (double)CONCAT17(in_stack_fffffffffffff637,
                                  CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
                 (bool)uVar3,(double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                 in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                 in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680,
                 in_stack_fffffffffffff688,in_stack_fffffffffffff690,in_stack_fffffffffffff698);
    }
    if ((phi != 0.0) || (NAN(phi))) {
      std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x140ca7);
      dVar186 = dx;
      dVar183 = xlength * 0.5 - x0;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = dVar183;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar186;
      auVar11._0_8_ = (double)*pvVar6;
      auVar11._8_8_ = uVar29;
      vfnmadd213sd_fma(auVar11,auVar33,auVar74);
      auVar151._8_8_ = 0x8000000000000000;
      auVar151._0_8_ = 0x8000000000000000;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = z00;
      vmovlpd_avx(auVar132 ^ auVar151);
      spatial_region::f_init_focused
                (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
                 in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                 (double)CONCAT17(in_stack_fffffffffffff637,
                                  CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
                 (bool)uVar3,(double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                 in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                 in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680,
                 in_stack_fffffffffffff688,in_stack_fffffffffffff690,in_stack_fffffffffffff698);
    }
    else {
      bVar1 = std::operator==(pbVar182,pcVar181);
      if (bVar1) {
        std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                  ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x140e60);
        std::operator==(pbVar182,pcVar181);
        std::operator==(pbVar182,pcVar181);
        dVar186 = dx;
        dVar183 = xlength * 0.5 + x0;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
        auVar75._8_8_ = 0;
        auVar75._0_8_ = dVar183;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar186;
        auVar12._0_8_ = (double)*pvVar6;
        auVar12._8_8_ = uVar29;
        auVar9 = vfnmadd213sd_fma(auVar12,auVar34,auVar75);
        uVar29 = auVar9._8_8_;
        auVar152._8_8_ = 0x8000000000000000;
        auVar152._0_8_ = 0x8000000000000000;
        auVar133._8_8_ = 0;
        auVar133._0_8_ = z00;
        pcVar181 = (char *)vmovlpd_avx(auVar133 ^ auVar152);
        pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        spatial_region::f_init_focused
                  (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
                   in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                   (double)CONCAT17(in_stack_fffffffffffff637,
                                    CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)),
                   (bool)uVar3,(double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620)
                   ,in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                   in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680,
                   in_stack_fffffffffffff688,in_stack_fffffffffffff690,in_stack_fffffffffffff698);
        bVar1 = std::operator==(pbVar182,pcVar181);
        if (bVar1) {
          std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                    ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x141087);
          std::operator==(pbVar182,pcVar181);
          std::operator==(pbVar182,pcVar181);
          dVar186 = dx;
          dVar183 = xlength * 0.5 + x0;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
          auVar76._8_8_ = 0;
          auVar76._0_8_ = dVar183;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar186;
          auVar13._0_8_ = (double)*pvVar6;
          auVar13._8_8_ = uVar29;
          auVar9 = vfnmadd213sd_fma(auVar13,auVar35,auVar76);
          uVar29 = auVar9._8_8_;
          pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pcVar181 = (char *)z00;
          spatial_region::f_init_focused
                    (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
                     in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                     (double)CONCAT17(in_stack_fffffffffffff637,
                                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630))
                     ,(bool)uVar3,
                     (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                     in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                     in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680,
                     in_stack_fffffffffffff688,in_stack_fffffffffffff690,in_stack_fffffffffffff698);
          std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                    ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x141280);
          std::operator==(pbVar182,pcVar181);
          std::operator==(pbVar182,pcVar181);
          dVar186 = dx;
          dVar183 = xlength * 0.5 + x0;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
          auVar77._8_8_ = 0;
          auVar77._0_8_ = dVar183;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = dVar186;
          auVar14._0_8_ = (double)*pvVar6;
          auVar14._8_8_ = uVar29;
          auVar9 = vfnmadd213sd_fma(auVar14,auVar36,auVar77);
          uVar29 = auVar9._8_8_;
          auVar153._8_8_ = 0x8000000000000000;
          auVar153._0_8_ = 0x8000000000000000;
          auVar134._8_8_ = 0;
          auVar134._0_8_ = z00;
          pcVar181 = (char *)vmovlpd_avx(auVar134 ^ auVar153);
          pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          spatial_region::f_init_focused
                    (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
                     in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                     (double)CONCAT17(in_stack_fffffffffffff637,
                                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630))
                     ,(bool)uVar3,
                     (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                     in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                     in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680,
                     in_stack_fffffffffffff688,in_stack_fffffffffffff690,in_stack_fffffffffffff698);
          bVar1 = std::operator==(pbVar182,pcVar181);
          if (bVar1) {
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x1414aa)
            ;
            std::operator==(pbVar182,pcVar181);
            std::operator==(pbVar182,pcVar181);
            dVar186 = dx;
            dVar183 = xlength * 0.5 - x0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
            auVar78._8_8_ = 0;
            auVar78._0_8_ = dVar183;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = dVar186;
            auVar15._0_8_ = (double)*pvVar6;
            auVar15._8_8_ = uVar29;
            auVar9 = vfnmadd213sd_fma(auVar15,auVar37,auVar78);
            uVar29 = auVar9._8_8_;
            pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            pcVar181 = (char *)z00;
            spatial_region::f_init_focused
                      (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650
                       ,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                       in_stack_fffffffffffff638,
                       (double)CONCAT17(in_stack_fffffffffffff637,
                                        CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630
                                                )),(bool)uVar3,
                       (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                       in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                       in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680
                       ,in_stack_fffffffffffff688,in_stack_fffffffffffff690,
                       in_stack_fffffffffffff698);
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x1416a3)
            ;
            std::operator==(pbVar182,pcVar181);
            std::operator==(pbVar182,pcVar181);
            dVar186 = dx;
            dVar183 = xlength * 0.5 - x0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
            auVar79._8_8_ = 0;
            auVar79._0_8_ = dVar183;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = dVar186;
            auVar16._0_8_ = (double)*pvVar6;
            auVar16._8_8_ = uVar29;
            auVar9 = vfnmadd213sd_fma(auVar16,auVar38,auVar79);
            uVar29 = auVar9._8_8_;
            auVar154._8_8_ = 0x8000000000000000;
            auVar154._0_8_ = 0x8000000000000000;
            auVar135._8_8_ = 0;
            auVar135._0_8_ = z00;
            pcVar181 = (char *)vmovlpd_avx(auVar135 ^ auVar154);
            pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            spatial_region::f_init_focused
                      (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650
                       ,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                       in_stack_fffffffffffff638,
                       (double)CONCAT17(in_stack_fffffffffffff637,
                                        CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630
                                                )),(bool)uVar3,
                       (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                       in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                       in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680
                       ,in_stack_fffffffffffff688,in_stack_fffffffffffff690,
                       in_stack_fffffffffffff698);
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x1418a0)
            ;
            std::operator==(pbVar182,pcVar181);
            std::operator==(pbVar182,pcVar181);
            dVar186 = dx;
            dVar183 = xlength * 0.5 - x0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
            auVar80._8_8_ = 0;
            auVar80._0_8_ = dVar183;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = dVar186;
            auVar17._0_8_ = (double)*pvVar6;
            auVar17._8_8_ = uVar29;
            auVar9 = vfnmadd213sd_fma(auVar17,auVar39,auVar80);
            uVar29 = auVar9._8_8_;
            pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            pcVar181 = (char *)z00;
            spatial_region::f_init_focused
                      (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650
                       ,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                       in_stack_fffffffffffff638,
                       (double)CONCAT17(in_stack_fffffffffffff637,
                                        CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630
                                                )),(bool)uVar3,
                       (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                       in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                       in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680
                       ,in_stack_fffffffffffff688,in_stack_fffffffffffff690,
                       in_stack_fffffffffffff698);
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x141a9c)
            ;
            std::operator==(pbVar182,pcVar181);
            std::operator==(pbVar182,pcVar181);
            dVar186 = dx;
            dVar183 = xlength * 0.5 - x0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
            auVar81._8_8_ = 0;
            auVar81._0_8_ = dVar183;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = dVar186;
            auVar18._0_8_ = (double)*pvVar6;
            auVar18._8_8_ = uVar29;
            vfnmadd213sd_fma(auVar18,auVar40,auVar81);
            auVar155._8_8_ = 0x8000000000000000;
            auVar155._0_8_ = 0x8000000000000000;
            auVar136._8_8_ = 0;
            auVar136._0_8_ = z00;
            vmovlpd_avx(auVar136 ^ auVar155);
            spatial_region::f_init_focused
                      (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650
                       ,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                       in_stack_fffffffffffff638,
                       (double)CONCAT17(in_stack_fffffffffffff637,
                                        CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630
                                                )),(bool)uVar3,
                       (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                       in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                       in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680
                       ,in_stack_fffffffffffff688,in_stack_fffffffffffff690,
                       in_stack_fffffffffffff698);
          }
        }
        else {
          bVar1 = std::operator==(pbVar182,pcVar181);
          if (bVar1) {
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x141cd1)
            ;
            std::operator==(pbVar182,pcVar181);
            std::operator==(pbVar182,pcVar181);
            dVar186 = dx;
            dVar183 = xlength * 0.5 - x0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
            auVar82._8_8_ = 0;
            auVar82._0_8_ = dVar183;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = dVar186;
            auVar19._0_8_ = (double)*pvVar6;
            auVar19._8_8_ = uVar29;
            auVar9 = vfnmadd213sd_fma(auVar19,auVar41,auVar82);
            uVar29 = auVar9._8_8_;
            pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            pcVar181 = (char *)z00;
            spatial_region::f_init_focused
                      (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650
                       ,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                       in_stack_fffffffffffff638,
                       (double)CONCAT17(in_stack_fffffffffffff637,
                                        CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630
                                                )),(bool)uVar3,
                       (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                       in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                       in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680
                       ,in_stack_fffffffffffff688,in_stack_fffffffffffff690,
                       in_stack_fffffffffffff698);
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x141eca)
            ;
            std::operator==(pbVar182,pcVar181);
            std::operator==(pbVar182,pcVar181);
            dVar186 = dx;
            dVar183 = xlength * 0.5 - x0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
            auVar83._8_8_ = 0;
            auVar83._0_8_ = dVar183;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = dVar186;
            auVar20._0_8_ = (double)*pvVar6;
            auVar20._8_8_ = uVar29;
            auVar9 = vfnmadd213sd_fma(auVar20,auVar42,auVar83);
            uVar29 = auVar9._8_8_;
            auVar156._8_8_ = 0x8000000000000000;
            auVar156._0_8_ = 0x8000000000000000;
            auVar137._8_8_ = 0;
            auVar137._0_8_ = z00;
            pcVar181 = (char *)vmovlpd_avx(auVar137 ^ auVar156);
            pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            spatial_region::f_init_focused
                      (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650
                       ,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                       in_stack_fffffffffffff638,
                       (double)CONCAT17(in_stack_fffffffffffff637,
                                        CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630
                                                )),(bool)uVar3,
                       (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                       in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                       in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680
                       ,in_stack_fffffffffffff688,in_stack_fffffffffffff690,
                       in_stack_fffffffffffff698);
            bVar1 = std::operator==(pbVar182,pcVar181);
            if (bVar1) {
              std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                        ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                         0x1420f4);
              std::operator==(pbVar182,pcVar181);
              std::operator==(pbVar182,pcVar181);
              dVar186 = dx;
              dVar183 = xlength * 0.5 - x0;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
              auVar84._8_8_ = 0;
              auVar84._0_8_ = dVar183;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = dVar186;
              auVar21._0_8_ = (double)*pvVar6;
              auVar21._8_8_ = uVar29;
              auVar9 = vfnmadd213sd_fma(auVar21,auVar43,auVar84);
              uVar29 = auVar9._8_8_;
              pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              pcVar181 = (char *)z00;
              spatial_region::f_init_focused
                        (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                         in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                         in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                         (double)CONCAT17(in_stack_fffffffffffff637,
                                          CONCAT16(in_stack_fffffffffffff636,
                                                   in_stack_fffffffffffff630)),(bool)uVar3,
                         (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                         in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                         in_stack_fffffffffffff678,in_stack_fffffffffffff610,
                         in_stack_fffffffffffff680,in_stack_fffffffffffff688,
                         in_stack_fffffffffffff690,in_stack_fffffffffffff698);
              std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                        ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                         0x1422f0);
              std::operator==(pbVar182,pcVar181);
              std::operator==(pbVar182,pcVar181);
              dVar186 = dx;
              dVar183 = xlength * 0.5 + x0;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
              auVar85._8_8_ = 0;
              auVar85._0_8_ = dVar183;
              auVar44._8_8_ = 0;
              auVar44._0_8_ = dVar186;
              auVar22._0_8_ = (double)*pvVar6;
              auVar22._8_8_ = uVar29;
              auVar9 = vfnmadd213sd_fma(auVar22,auVar44,auVar85);
              uVar29 = auVar9._8_8_;
              pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              pcVar181 = (char *)z00;
              spatial_region::f_init_focused
                        (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                         in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                         in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                         (double)CONCAT17(in_stack_fffffffffffff637,
                                          CONCAT16(in_stack_fffffffffffff636,
                                                   in_stack_fffffffffffff630)),(bool)uVar3,
                         (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                         in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                         in_stack_fffffffffffff678,in_stack_fffffffffffff610,
                         in_stack_fffffffffffff680,in_stack_fffffffffffff688,
                         in_stack_fffffffffffff690,in_stack_fffffffffffff698);
              std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                        ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                         0x1424e9);
              std::operator==(pbVar182,pcVar181);
              std::operator==(pbVar182,pcVar181);
              dVar186 = dx;
              dVar183 = xlength * 0.5 - x0;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
              auVar86._8_8_ = 0;
              auVar86._0_8_ = dVar183;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = dVar186;
              auVar23._0_8_ = (double)*pvVar6;
              auVar23._8_8_ = uVar29;
              auVar9 = vfnmadd213sd_fma(auVar23,auVar45,auVar86);
              uVar29 = auVar9._8_8_;
              auVar157._8_8_ = 0x8000000000000000;
              auVar157._0_8_ = 0x8000000000000000;
              auVar138._8_8_ = 0;
              auVar138._0_8_ = z00;
              pcVar181 = (char *)vmovlpd_avx(auVar138 ^ auVar157);
              pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              spatial_region::f_init_focused
                        (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                         in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                         in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                         (double)CONCAT17(in_stack_fffffffffffff637,
                                          CONCAT16(in_stack_fffffffffffff636,
                                                   in_stack_fffffffffffff630)),(bool)uVar3,
                         (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                         in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                         in_stack_fffffffffffff678,in_stack_fffffffffffff610,
                         in_stack_fffffffffffff680,in_stack_fffffffffffff688,
                         in_stack_fffffffffffff690,in_stack_fffffffffffff698);
              std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                        ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                         0x1426ea);
              std::operator==(pbVar182,pcVar181);
              std::operator==(pbVar182,pcVar181);
              dVar186 = dx;
              dVar183 = xlength * 0.5 + x0;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
              auVar87._8_8_ = 0;
              auVar87._0_8_ = dVar183;
              auVar46._8_8_ = 0;
              auVar46._0_8_ = dVar186;
              auVar24._0_8_ = (double)*pvVar6;
              auVar24._8_8_ = uVar29;
              vfnmadd213sd_fma(auVar24,auVar46,auVar87);
              auVar158._8_8_ = 0x8000000000000000;
              auVar158._0_8_ = 0x8000000000000000;
              auVar139._8_8_ = 0;
              auVar139._0_8_ = z00;
              vmovlpd_avx(auVar139 ^ auVar158);
              spatial_region::f_init_focused
                        (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                         in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                         in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                         (double)CONCAT17(in_stack_fffffffffffff637,
                                          CONCAT16(in_stack_fffffffffffff636,
                                                   in_stack_fffffffffffff630)),(bool)uVar3,
                         (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                         in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                         in_stack_fffffffffffff678,in_stack_fffffffffffff610,
                         in_stack_fffffffffffff680,in_stack_fffffffffffff688,
                         in_stack_fffffffffffff690,in_stack_fffffffffffff698);
            }
          }
        }
      }
      else {
        bVar1 = std::operator==(pbVar182,pcVar181);
        if (bVar1) {
          std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                    ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x14291f);
          std::operator==(pbVar182,pcVar181);
          std::operator==(pbVar182,pcVar181);
          dVar186 = dx;
          dVar183 = xlength * 0.5 + x0;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
          auVar88._8_8_ = 0;
          auVar88._0_8_ = dVar183;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = dVar186;
          auVar25._0_8_ = (double)*pvVar6;
          auVar25._8_8_ = uVar29;
          auVar9 = vfnmadd213sd_fma(auVar25,auVar47,auVar88);
          uVar29 = auVar9._8_8_;
          pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pcVar181 = (char *)z00;
          spatial_region::f_init_focused
                    (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650,
                     in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                     (double)CONCAT17(in_stack_fffffffffffff637,
                                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630))
                     ,(bool)uVar3,
                     (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                     in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                     in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680,
                     in_stack_fffffffffffff688,in_stack_fffffffffffff690,in_stack_fffffffffffff698);
          bVar1 = std::operator==(pbVar182,pcVar181);
          if (bVar1) {
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x142b45)
            ;
            std::operator==(pbVar182,pcVar181);
            std::operator==(pbVar182,pcVar181);
            dVar186 = dx;
            dVar183 = xlength * 0.5 - x0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
            auVar89._8_8_ = 0;
            auVar89._0_8_ = dVar183;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = dVar186;
            auVar26._0_8_ = (double)*pvVar6;
            auVar26._8_8_ = uVar29;
            auVar9 = vfnmadd213sd_fma(auVar26,auVar48,auVar89);
            uVar29 = auVar9._8_8_;
            pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            pcVar181 = (char *)z00;
            spatial_region::f_init_focused
                      (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650
                       ,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                       in_stack_fffffffffffff638,
                       (double)CONCAT17(in_stack_fffffffffffff637,
                                        CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630
                                                )),(bool)uVar3,
                       (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                       in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                       in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680
                       ,in_stack_fffffffffffff688,in_stack_fffffffffffff690,
                       in_stack_fffffffffffff698);
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x142d41)
            ;
            std::operator==(pbVar182,pcVar181);
            std::operator==(pbVar182,pcVar181);
            dVar186 = dx;
            dVar183 = xlength * 0.5 - x0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
            auVar90._8_8_ = 0;
            auVar90._0_8_ = dVar183;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = dVar186;
            auVar27._0_8_ = (double)*pvVar6;
            auVar27._8_8_ = uVar29;
            vfnmadd213sd_fma(auVar27,auVar49,auVar90);
            spatial_region::f_init_focused
                      (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650
                       ,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                       in_stack_fffffffffffff638,
                       (double)CONCAT17(in_stack_fffffffffffff637,
                                        CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630
                                                )),(bool)uVar3,
                       (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                       in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                       in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680
                       ,in_stack_fffffffffffff688,in_stack_fffffffffffff690,
                       in_stack_fffffffffffff698);
          }
        }
        else {
          bVar1 = std::operator==(pbVar182,pcVar181);
          if (bVar1) {
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x142f6e)
            ;
            std::operator==(pbVar182,pcVar181);
            std::operator==(pbVar182,pcVar181);
            dVar186 = dx;
            dVar183 = xlength * 0.5 - x0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
            auVar91._8_8_ = 0;
            auVar91._0_8_ = dVar183;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = dVar186;
            auVar28._0_8_ = (double)*pvVar6;
            auVar28._8_8_ = uVar29;
            vfnmadd213sd_fma(auVar28,auVar50,auVar91);
            spatial_region::f_init_focused
                      (in_stack_fffffffffffff660,in_stack_fffffffffffff658,in_stack_fffffffffffff650
                       ,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                       in_stack_fffffffffffff638,
                       (double)CONCAT17(in_stack_fffffffffffff637,
                                        CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630
                                                )),(bool)uVar3,
                       (double)CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                       in_stack_fffffffffffff618,in_stack_fffffffffffff670,(bool)uVar2,
                       in_stack_fffffffffffff678,in_stack_fffffffffffff610,in_stack_fffffffffffff680
                       ,in_stack_fffffffffffff688,in_stack_fffffffffffff690,
                       in_stack_fffffffffffff698);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_48);
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffff030,in_stack_fffffffffffff028);
    if (bVar1) {
      std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x143221);
      spatial_region::f_init_uniformB
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058,in_stack_fffffffffffff050);
    }
    else {
      bVar1 = std::operator!=(in_stack_fffffffffffff030,in_stack_fffffffffffff028);
      if ((bVar1) && (mpi_rank == 0)) {
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)TERM_RED_abi_cxx11_);
        poVar5 = std::operator<<(poVar5,"Unknown f_envelope value [");
        poVar5 = std::operator<<(poVar5,(string *)f_envelope_abi_cxx11_);
        poVar5 = std::operator<<(poVar5,"] during initialization");
        poVar5 = std::operator<<(poVar5,(string *)TERM_NO_COLOR_abi_cxx11_);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      local_140 = std::__cxx11::string::c_str();
      local_144 = std::__cxx11::string::size();
      local_150 = std::__cxx11::string::c_str();
      local_154 = std::__cxx11::string::size();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"",&local_179);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a0,"",&local_1a1);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,"",&local_1c9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f0,"",&local_1f1);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,"",&local_219);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,"",&local_241);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      local_248 = 0;
      while( true ) {
        bVar1 = false;
        if (local_248 < local_144) {
          bVar1 = *(char *)(local_140 + local_248) != '&';
        }
        if (!bVar1) break;
        std::__cxx11::string::operator+=(local_178,*(char *)(local_140 + local_248));
        local_248 = local_248 + 1;
      }
      local_248 = local_248 + 1;
      if (local_248 < local_144) {
        while( true ) {
          bVar1 = false;
          if (local_248 < local_144) {
            bVar1 = *(char *)(local_140 + local_248) != '&';
          }
          if (!bVar1) break;
          std::__cxx11::string::operator+=(local_1a0,*(char *)(local_140 + local_248));
          local_248 = local_248 + 1;
        }
      }
      local_248 = local_248 + 1;
      if (local_248 < local_144) {
        while( true ) {
          bVar1 = false;
          if (local_248 < local_144) {
            bVar1 = *(char *)(local_140 + local_248) != '&';
          }
          if (!bVar1) break;
          std::__cxx11::string::operator+=(local_1c8,*(char *)(local_140 + local_248));
          local_248 = local_248 + 1;
        }
      }
      local_248 = 0;
      while( true ) {
        bVar1 = false;
        if (local_248 < local_154) {
          bVar1 = *(char *)(local_150 + local_248) != '&';
        }
        if (!bVar1) break;
        std::__cxx11::string::operator+=(local_1f0,*(char *)(local_150 + local_248));
        local_248 = local_248 + 1;
      }
      local_248 = local_248 + 1;
      if (local_248 < local_154) {
        while( true ) {
          bVar1 = false;
          if (local_248 < local_154) {
            bVar1 = *(char *)(local_150 + local_248) != '&';
          }
          if (!bVar1) break;
          std::__cxx11::string::operator+=(local_218,*(char *)(local_150 + local_248));
          local_248 = local_248 + 1;
        }
      }
      uVar2 = (undefined1)((ulong)in_stack_fffffffffffff390 >> 0x38);
      local_248 = local_248 + 1;
      if (local_248 < local_154) {
        while( true ) {
          uVar2 = (undefined1)((ulong)in_stack_fffffffffffff390 >> 0x38);
          bVar1 = false;
          if (local_248 < local_154) {
            bVar1 = *(char *)(local_150 + local_248) != '&';
          }
          if (!bVar1) break;
          std::__cxx11::string::operator+=(local_240,*(char *)(local_150 + local_248));
          local_248 = local_248 + 1;
        }
      }
      if ((phi_rotate != 0.0) || (NAN(phi_rotate))) {
        std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                  ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x143989);
        dVar186 = dx;
        dVar183 = xlength * 0.5 + x0;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
        auVar112._8_8_ = 0;
        auVar112._0_8_ = dVar183;
        auVar92._8_8_ = 0;
        auVar92._0_8_ = dVar186;
        auVar51._0_8_ = (double)*pvVar6;
        auVar51._8_8_ = in_XMM5_Qb;
        vfnmadd213sd_fma(auVar51,auVar92,auVar112);
        spatial_region::f_init_cos
                  (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                   (double)CONCAT17(in_stack_fffffffffffff3cf,
                                    CONCAT16(in_stack_fffffffffffff3ce,in_stack_fffffffffffff3c8)),
                   in_stack_fffffffffffff3c0,
                   (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                   in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                   (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                   in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,
                   (bool)uVar2,(double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400)
                   ,in_stack_fffffffffffff408,
                   (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                   in_stack_fffffffffffff418);
      }
      else {
        std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                  ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x143b11);
        dVar183 = xlength * 0.5 + x0;
        dVar186 = dx;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
        auVar113._8_8_ = 0;
        auVar113._0_8_ = dVar183;
        auVar93._8_8_ = 0;
        auVar93._0_8_ = dVar186;
        auVar52._0_8_ = (double)*pvVar6;
        auVar52._8_8_ = in_XMM5_Qb;
        auVar9 = vfnmadd213sd_fma(auVar52,auVar93,auVar113);
        uVar29 = auVar9._8_8_;
        pcVar181 = (char *)y00;
        pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)z00;
        spatial_region::f_init_cos
                  (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                   (double)CONCAT17(in_stack_fffffffffffff3cf,
                                    CONCAT16(in_stack_fffffffffffff3ce,in_stack_fffffffffffff3c8)),
                   in_stack_fffffffffffff3c0,
                   (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                   in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                   (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                   in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,
                   (bool)uVar2,(double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400)
                   ,in_stack_fffffffffffff408,
                   (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                   in_stack_fffffffffffff418);
        if ((phi != 0.0) || (NAN(phi))) {
          std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                    ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x143ca8);
          dVar183 = xlength * 0.5 - x0;
          dVar186 = dx;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
          auVar114._8_8_ = 0;
          auVar114._0_8_ = dVar183;
          auVar94._8_8_ = 0;
          auVar94._0_8_ = dVar186;
          auVar53._0_8_ = (double)*pvVar6;
          auVar53._8_8_ = uVar29;
          vfnmadd213sd_fma(auVar53,auVar94,auVar114);
          auVar173._8_8_ = 0x8000000000000000;
          auVar173._0_8_ = 0x8000000000000000;
          auVar140._8_8_ = 0;
          auVar140._0_8_ = y00;
          auVar159._8_8_ = 0;
          auVar159._0_8_ = z00;
          vmovlpd_avx(auVar159 ^ auVar173);
          vmovlpd_avx(auVar140 ^ auVar173);
          spatial_region::f_init_cos
                    (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                     (double)CONCAT17(in_stack_fffffffffffff3cf,
                                      CONCAT16(in_stack_fffffffffffff3ce,in_stack_fffffffffffff3c8))
                     ,in_stack_fffffffffffff3c0,
                     (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                     in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                     (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                     in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,
                     (bool)uVar2,
                     (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                     in_stack_fffffffffffff408,
                     (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                     in_stack_fffffffffffff418);
        }
        else {
          bVar1 = std::operator==(pbVar182,pcVar181);
          if (bVar1) {
            std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                      ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x143e73)
            ;
            std::operator==(pbVar182,pcVar181);
            std::operator==(pbVar182,pcVar181);
            dVar186 = dx;
            dVar183 = xlength * 0.5 + x0;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
            auVar115._8_8_ = 0;
            auVar115._0_8_ = dVar183;
            auVar95._8_8_ = 0;
            auVar95._0_8_ = dVar186;
            auVar54._0_8_ = (double)*pvVar6;
            auVar54._8_8_ = uVar29;
            auVar9 = vfnmadd213sd_fma(auVar54,auVar95,auVar115);
            uVar29 = auVar9._8_8_;
            auVar174._8_8_ = 0x8000000000000000;
            auVar174._0_8_ = 0x8000000000000000;
            auVar160._8_8_ = 0;
            auVar160._0_8_ = z00;
            pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       vmovlpd_avx(auVar160 ^ auVar174);
            pcVar181 = (char *)y00;
            spatial_region::f_init_cos
                      (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0
                       ,(double)CONCAT17(in_stack_fffffffffffff3cf,
                                         CONCAT16(in_stack_fffffffffffff3ce,
                                                  in_stack_fffffffffffff3c8)),
                       in_stack_fffffffffffff3c0,
                       (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                       in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                       (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                       in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8
                       ,(bool)uVar2,
                       (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                       in_stack_fffffffffffff408,
                       (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                       in_stack_fffffffffffff418);
            bVar1 = std::operator==(pbVar182,pcVar181);
            if (bVar1) {
              std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                        ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                         0x1440ab);
              std::operator==(pbVar182,pcVar181);
              std::operator==(pbVar182,pcVar181);
              dVar186 = dx;
              dVar183 = xlength * 0.5 + x0;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
              auVar116._8_8_ = 0;
              auVar116._0_8_ = dVar183;
              auVar96._8_8_ = 0;
              auVar96._0_8_ = dVar186;
              auVar55._0_8_ = (double)*pvVar6;
              auVar55._8_8_ = uVar29;
              auVar9 = vfnmadd213sd_fma(auVar55,auVar96,auVar116);
              uVar29 = auVar9._8_8_;
              auVar161._8_8_ = 0x8000000000000000;
              auVar161._0_8_ = 0x8000000000000000;
              auVar141._8_8_ = 0;
              auVar141._0_8_ = y00;
              pcVar181 = (char *)vmovlpd_avx(auVar141 ^ auVar161);
              pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)z00;
              spatial_region::f_init_cos
                        (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                         in_stack_fffffffffffff3d0,
                         (double)CONCAT17(in_stack_fffffffffffff3cf,
                                          CONCAT16(in_stack_fffffffffffff3ce,
                                                   in_stack_fffffffffffff3c8)),
                         in_stack_fffffffffffff3c0,
                         (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                         in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                         (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                         in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,
                         in_stack_fffffffffffff3f8,(bool)uVar2,
                         (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                         in_stack_fffffffffffff408,
                         (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                         in_stack_fffffffffffff418);
              std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                        ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                         0x1442b6);
              std::operator==(pbVar182,pcVar181);
              std::operator==(pbVar182,pcVar181);
              dVar186 = dx;
              dVar183 = xlength * 0.5 + x0;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
              auVar117._8_8_ = 0;
              auVar117._0_8_ = dVar183;
              auVar97._8_8_ = 0;
              auVar97._0_8_ = dVar186;
              auVar56._0_8_ = (double)*pvVar6;
              auVar56._8_8_ = uVar29;
              auVar9 = vfnmadd213sd_fma(auVar56,auVar97,auVar117);
              uVar29 = auVar9._8_8_;
              auVar175._8_8_ = 0x8000000000000000;
              auVar175._0_8_ = 0x8000000000000000;
              auVar142._8_8_ = 0;
              auVar142._0_8_ = y00;
              auVar162._8_8_ = 0;
              auVar162._0_8_ = z00;
              pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         vmovlpd_avx(auVar162 ^ auVar175);
              pcVar181 = (char *)vmovlpd_avx(auVar142 ^ auVar175);
              spatial_region::f_init_cos
                        (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                         in_stack_fffffffffffff3d0,
                         (double)CONCAT17(in_stack_fffffffffffff3cf,
                                          CONCAT16(in_stack_fffffffffffff3ce,
                                                   in_stack_fffffffffffff3c8)),
                         in_stack_fffffffffffff3c0,
                         (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                         in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                         (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                         in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,
                         in_stack_fffffffffffff3f8,(bool)uVar2,
                         (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                         in_stack_fffffffffffff408,
                         (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                         in_stack_fffffffffffff418);
              bVar1 = std::operator==(pbVar182,pcVar181);
              if (bVar1) {
                std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                          ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                           0x1444f2);
                std::operator==(pbVar182,pcVar181);
                std::operator==(pbVar182,pcVar181);
                dVar186 = dx;
                dVar183 = xlength * 0.5 - x0;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                auVar118._8_8_ = 0;
                auVar118._0_8_ = dVar183;
                auVar98._8_8_ = 0;
                auVar98._0_8_ = dVar186;
                auVar57._0_8_ = (double)*pvVar6;
                auVar57._8_8_ = uVar29;
                auVar9 = vfnmadd213sd_fma(auVar57,auVar98,auVar118);
                uVar29 = auVar9._8_8_;
                pcVar181 = (char *)y00;
                pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)z00;
                spatial_region::f_init_cos
                          (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                           in_stack_fffffffffffff3d0,
                           (double)CONCAT17(in_stack_fffffffffffff3cf,
                                            CONCAT16(in_stack_fffffffffffff3ce,
                                                     in_stack_fffffffffffff3c8)),
                           in_stack_fffffffffffff3c0,
                           (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                           in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                           (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                           in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,
                           in_stack_fffffffffffff3f8,(bool)uVar2,
                           (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                           in_stack_fffffffffffff408,
                           (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                           in_stack_fffffffffffff418);
                std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                          ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                           0x1446fc);
                std::operator==(pbVar182,pcVar181);
                std::operator==(pbVar182,pcVar181);
                dVar186 = dx;
                dVar183 = xlength * 0.5 - x0;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                auVar119._8_8_ = 0;
                auVar119._0_8_ = dVar183;
                auVar99._8_8_ = 0;
                auVar99._0_8_ = dVar186;
                auVar58._0_8_ = (double)*pvVar6;
                auVar58._8_8_ = uVar29;
                auVar9 = vfnmadd213sd_fma(auVar58,auVar99,auVar119);
                uVar29 = auVar9._8_8_;
                auVar176._8_8_ = 0x8000000000000000;
                auVar176._0_8_ = 0x8000000000000000;
                auVar163._8_8_ = 0;
                auVar163._0_8_ = z00;
                pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           vmovlpd_avx(auVar163 ^ auVar176);
                pcVar181 = (char *)y00;
                spatial_region::f_init_cos
                          (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                           in_stack_fffffffffffff3d0,
                           (double)CONCAT17(in_stack_fffffffffffff3cf,
                                            CONCAT16(in_stack_fffffffffffff3ce,
                                                     in_stack_fffffffffffff3c8)),
                           in_stack_fffffffffffff3c0,
                           (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                           in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                           (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                           in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,
                           in_stack_fffffffffffff3f8,(bool)uVar2,
                           (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                           in_stack_fffffffffffff408,
                           (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                           in_stack_fffffffffffff418);
                std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                          ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                           0x14490a);
                std::operator==(pbVar182,pcVar181);
                std::operator==(pbVar182,pcVar181);
                dVar186 = dx;
                dVar183 = xlength * 0.5 - x0;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                auVar120._8_8_ = 0;
                auVar120._0_8_ = dVar183;
                auVar100._8_8_ = 0;
                auVar100._0_8_ = dVar186;
                auVar59._0_8_ = (double)*pvVar6;
                auVar59._8_8_ = uVar29;
                auVar9 = vfnmadd213sd_fma(auVar59,auVar100,auVar120);
                uVar29 = auVar9._8_8_;
                auVar164._8_8_ = 0x8000000000000000;
                auVar164._0_8_ = 0x8000000000000000;
                auVar143._8_8_ = 0;
                auVar143._0_8_ = y00;
                pcVar181 = (char *)vmovlpd_avx(auVar143 ^ auVar164);
                pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)z00;
                spatial_region::f_init_cos
                          (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                           in_stack_fffffffffffff3d0,
                           (double)CONCAT17(in_stack_fffffffffffff3cf,
                                            CONCAT16(in_stack_fffffffffffff3ce,
                                                     in_stack_fffffffffffff3c8)),
                           in_stack_fffffffffffff3c0,
                           (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                           in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                           (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                           in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,
                           in_stack_fffffffffffff3f8,(bool)uVar2,
                           (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                           in_stack_fffffffffffff408,
                           (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                           in_stack_fffffffffffff418);
                psVar7 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::
                         operator->((unique_ptr<spatial_region,_std::default_delete<spatial_region>_>
                                     *)0x144b18);
                bVar1 = std::operator==(pbVar182,pcVar181);
                dVar183 = (double)(int)((uint)bVar1 * -2 + 1) * a0y;
                uVar3 = std::operator==(pbVar182,pcVar181);
                uVar188 = 1;
                this = (spatial_region *)((double)(int)((uint)(byte)uVar3 * -2 + 1) * a0z);
                dVar186 = xlength * 0.5 - x0;
                dVar187 = dx;
                dVar184 = ysigma;
                dVar185 = zsigma;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                auVar121._8_8_ = 0;
                auVar121._0_8_ = dVar186;
                auVar101._8_8_ = 0;
                auVar101._0_8_ = dVar187;
                auVar60._0_8_ = (double)*pvVar6;
                auVar60._8_8_ = uVar29;
                vfnmadd213sd_fma(auVar60,auVar101,auVar121);
                auVar177._8_8_ = 0x8000000000000000;
                auVar177._0_8_ = 0x8000000000000000;
                auVar144._8_8_ = 0;
                auVar144._0_8_ = y00;
                auVar165._8_8_ = 0;
                auVar165._0_8_ = z00;
                vmovlpd_avx(auVar165 ^ auVar177);
                vmovlpd_avx(auVar144 ^ auVar177);
                spatial_region::f_init_cos
                          (this,dVar187,dVar186,
                           (double)CONCAT17(in_stack_fffffffffffff3cf,
                                            CONCAT16(in_stack_fffffffffffff3ce,
                                                     in_stack_fffffffffffff3c8)),
                           in_stack_fffffffffffff3c0,
                           (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                           in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                           (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                           in_stack_fffffffffffff398,dVar184,dVar185,(bool)uVar2,
                           (double)CONCAT44(uVar188,in_stack_fffffffffffff400),dVar183,
                           (double)CONCAT17(uVar3,in_stack_fffffffffffff410),(double)psVar7);
              }
            }
            else {
              uVar2 = std::operator==(pbVar182,pcVar181);
              if ((bool)uVar2) {
                psVar7 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::
                         operator->((unique_ptr<spatial_region,_std::default_delete<spatial_region>_>
                                     *)0x144d5f);
                uVar3 = std::operator==(pbVar182,pcVar181);
                dVar183 = (double)(int)((uint)(byte)uVar3 * -2 + 1) * a0y;
                uVar4 = std::operator==(pbVar182,pcVar181);
                dVar187 = dx;
                sscos = 1;
                dVar186 = xlength * 0.5 - x0;
                dVar184 = xsigma;
                dVar185 = ysigma;
                x1 = zsigma;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                auVar122._8_8_ = 0;
                auVar122._0_8_ = dVar186;
                auVar102._8_8_ = 0;
                auVar102._0_8_ = dVar187;
                auVar61._0_8_ = (double)*pvVar6;
                auVar61._8_8_ = uVar29;
                auVar9 = vfnmadd213sd_fma(auVar61,auVar102,auVar122);
                uVar29 = auVar9._8_8_;
                append = (undefined1)((ulong)dVar184 >> 0x38);
                pcVar181 = (char *)y00;
                pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)z00;
                spatial_region::f_init_cos
                          (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                           in_stack_fffffffffffff3d0,
                           (double)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff3c8)),
                           (double)psVar7,(double)CONCAT17(uVar4,in_stack_fffffffffffff3b8),dVar183,
                           sscos,(bool)in_stack_fffffffffffff3ab,x1,dVar185,
                           in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,(bool)append,
                           (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                           in_stack_fffffffffffff408,
                           (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                           in_stack_fffffffffffff418);
                std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                          ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                           0x144f69);
                std::operator==(pbVar182,pcVar181);
                std::operator==(pbVar182,pcVar181);
                dVar187 = dx;
                dVar186 = xlength * 0.5 - x0;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                auVar123._8_8_ = 0;
                auVar123._0_8_ = dVar186;
                auVar103._8_8_ = 0;
                auVar103._0_8_ = dVar187;
                auVar62._0_8_ = (double)*pvVar6;
                auVar62._8_8_ = uVar29;
                auVar9 = vfnmadd213sd_fma(auVar62,auVar103,auVar123);
                uVar29 = auVar9._8_8_;
                auVar178._8_8_ = 0x8000000000000000;
                auVar178._0_8_ = 0x8000000000000000;
                auVar166._8_8_ = 0;
                auVar166._0_8_ = z00;
                pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           vmovlpd_avx(auVar166 ^ auVar178);
                pcVar181 = (char *)y00;
                spatial_region::f_init_cos
                          (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                           in_stack_fffffffffffff3d0,
                           (double)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff3c8)),
                           (double)psVar7,(double)CONCAT17(uVar4,in_stack_fffffffffffff3b8),dVar183,
                           sscos,(bool)in_stack_fffffffffffff3ab,x1,dVar185,
                           in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,(bool)append,
                           (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                           in_stack_fffffffffffff408,
                           (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                           in_stack_fffffffffffff418);
                bVar1 = std::operator==(pbVar182,pcVar181);
                if (bVar1) {
                  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                             0x1451a4);
                  std::operator==(pbVar182,pcVar181);
                  std::operator==(pbVar182,pcVar181);
                  dVar187 = dx;
                  dVar186 = xlength * 0.5 - x0;
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                  auVar124._8_8_ = 0;
                  auVar124._0_8_ = dVar186;
                  auVar104._8_8_ = 0;
                  auVar104._0_8_ = dVar187;
                  auVar63._0_8_ = (double)*pvVar6;
                  auVar63._8_8_ = uVar29;
                  auVar9 = vfnmadd213sd_fma(auVar63,auVar104,auVar124);
                  uVar29 = auVar9._8_8_;
                  auVar167._8_8_ = 0x8000000000000000;
                  auVar167._0_8_ = 0x8000000000000000;
                  auVar145._8_8_ = 0;
                  auVar145._0_8_ = y00;
                  pcVar181 = (char *)vmovlpd_avx(auVar145 ^ auVar167);
                  pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             z00;
                  spatial_region::f_init_cos
                            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                             in_stack_fffffffffffff3d0,
                             (double)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff3c8)),
                             (double)psVar7,(double)CONCAT17(uVar4,in_stack_fffffffffffff3b8),
                             dVar183,sscos,(bool)in_stack_fffffffffffff3ab,x1,dVar185,
                             in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,(bool)append,
                             (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                             in_stack_fffffffffffff408,
                             (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                             in_stack_fffffffffffff418);
                  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                             0x1453b2);
                  std::operator==(pbVar182,pcVar181);
                  std::operator==(pbVar182,pcVar181);
                  dVar187 = dx;
                  dVar186 = x0 + xlength * 0.5;
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                  auVar125._8_8_ = 0;
                  auVar125._0_8_ = dVar186;
                  auVar105._8_8_ = 0;
                  auVar105._0_8_ = dVar187;
                  auVar64._0_8_ = (double)*pvVar6;
                  auVar64._8_8_ = uVar29;
                  auVar9 = vfnmadd213sd_fma(auVar64,auVar105,auVar125);
                  uVar29 = auVar9._8_8_;
                  auVar168._8_8_ = 0x8000000000000000;
                  auVar168._0_8_ = 0x8000000000000000;
                  auVar146._8_8_ = 0;
                  auVar146._0_8_ = y00;
                  pcVar181 = (char *)vmovlpd_avx(auVar146 ^ auVar168);
                  pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             z00;
                  spatial_region::f_init_cos
                            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                             in_stack_fffffffffffff3d0,
                             (double)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff3c8)),
                             (double)psVar7,(double)CONCAT17(uVar4,in_stack_fffffffffffff3b8),
                             dVar183,sscos,(bool)in_stack_fffffffffffff3ab,x1,dVar185,
                             in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,(bool)append,
                             (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                             in_stack_fffffffffffff408,
                             (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                             in_stack_fffffffffffff418);
                  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                             0x1455bd);
                  std::operator==(pbVar182,pcVar181);
                  std::operator==(pbVar182,pcVar181);
                  dVar187 = dx;
                  dVar186 = xlength * 0.5 - x0;
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                  auVar126._8_8_ = 0;
                  auVar126._0_8_ = dVar186;
                  auVar106._8_8_ = 0;
                  auVar106._0_8_ = dVar187;
                  auVar65._0_8_ = (double)*pvVar6;
                  auVar65._8_8_ = uVar29;
                  auVar9 = vfnmadd213sd_fma(auVar65,auVar106,auVar126);
                  uVar29 = auVar9._8_8_;
                  auVar179._8_8_ = 0x8000000000000000;
                  auVar179._0_8_ = 0x8000000000000000;
                  auVar147._8_8_ = 0;
                  auVar147._0_8_ = y00;
                  auVar169._8_8_ = 0;
                  auVar169._0_8_ = z00;
                  pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             vmovlpd_avx(auVar169 ^ auVar179);
                  pcVar181 = (char *)vmovlpd_avx(auVar147 ^ auVar179);
                  spatial_region::f_init_cos
                            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                             in_stack_fffffffffffff3d0,
                             (double)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff3c8)),
                             (double)psVar7,(double)CONCAT17(uVar4,in_stack_fffffffffffff3b8),
                             dVar183,sscos,(bool)in_stack_fffffffffffff3ab,x1,dVar185,
                             in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,(bool)append,
                             (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                             in_stack_fffffffffffff408,
                             (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                             in_stack_fffffffffffff418);
                  std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                            ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                             0x1457d0);
                  std::operator==(pbVar182,pcVar181);
                  std::operator==(pbVar182,pcVar181);
                  dVar187 = dx;
                  dVar186 = x0 + xlength * 0.5;
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                  auVar127._8_8_ = 0;
                  auVar127._0_8_ = dVar186;
                  auVar107._8_8_ = 0;
                  auVar107._0_8_ = dVar187;
                  auVar66._0_8_ = (double)*pvVar6;
                  auVar66._8_8_ = uVar29;
                  vfnmadd213sd_fma(auVar66,auVar107,auVar127);
                  auVar180._8_8_ = 0x8000000000000000;
                  auVar180._0_8_ = 0x8000000000000000;
                  auVar148._8_8_ = 0;
                  auVar148._0_8_ = y00;
                  auVar170._8_8_ = 0;
                  auVar170._0_8_ = z00;
                  vmovlpd_avx(auVar170 ^ auVar180);
                  vmovlpd_avx(auVar148 ^ auVar180);
                  spatial_region::f_init_cos
                            (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                             in_stack_fffffffffffff3d0,
                             (double)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff3c8)),
                             (double)psVar7,(double)CONCAT17(uVar4,in_stack_fffffffffffff3b8),
                             dVar183,sscos,(bool)in_stack_fffffffffffff3ab,x1,dVar185,
                             in_stack_fffffffffffff3f0,in_stack_fffffffffffff3f8,(bool)append,
                             (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                             in_stack_fffffffffffff408,
                             (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                             in_stack_fffffffffffff418);
                }
              }
            }
          }
          else {
            bVar1 = std::operator==(pbVar182,pcVar181);
            if (bVar1) {
              std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                        ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                         0x145a17);
              std::operator==(pbVar182,pcVar181);
              std::operator==(pbVar182,pcVar181);
              dVar186 = dx;
              dVar183 = xlength * 0.5 + x0;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
              auVar128._8_8_ = 0;
              auVar128._0_8_ = dVar183;
              auVar108._8_8_ = 0;
              auVar108._0_8_ = dVar186;
              auVar67._0_8_ = (double)*pvVar6;
              auVar67._8_8_ = uVar29;
              auVar9 = vfnmadd213sd_fma(auVar67,auVar108,auVar128);
              uVar29 = auVar9._8_8_;
              auVar171._8_8_ = 0x8000000000000000;
              auVar171._0_8_ = 0x8000000000000000;
              auVar149._8_8_ = 0;
              auVar149._0_8_ = y00;
              pcVar181 = (char *)vmovlpd_avx(auVar149 ^ auVar171);
              pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)z00;
              spatial_region::f_init_cos
                        (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                         in_stack_fffffffffffff3d0,
                         (double)CONCAT17(in_stack_fffffffffffff3cf,
                                          CONCAT16(in_stack_fffffffffffff3ce,
                                                   in_stack_fffffffffffff3c8)),
                         in_stack_fffffffffffff3c0,
                         (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                         in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                         (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                         in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,
                         in_stack_fffffffffffff3f8,(bool)uVar2,
                         (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                         in_stack_fffffffffffff408,
                         (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                         in_stack_fffffffffffff418);
              bVar1 = std::operator==(pbVar182,pcVar181);
              if (bVar1) {
                std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                          ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                           0x145c4f);
                std::operator==(pbVar182,pcVar181);
                std::operator==(pbVar182,pcVar181);
                dVar186 = dx;
                dVar183 = xlength * 0.5 - x0;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                auVar129._8_8_ = 0;
                auVar129._0_8_ = dVar183;
                auVar109._8_8_ = 0;
                auVar109._0_8_ = dVar186;
                auVar68._0_8_ = (double)*pvVar6;
                auVar68._8_8_ = uVar29;
                auVar9 = vfnmadd213sd_fma(auVar68,auVar109,auVar129);
                uVar29 = auVar9._8_8_;
                auVar172._8_8_ = 0x8000000000000000;
                auVar172._0_8_ = 0x8000000000000000;
                auVar150._8_8_ = 0;
                auVar150._0_8_ = y00;
                pcVar181 = (char *)vmovlpd_avx(auVar150 ^ auVar172);
                pbVar182 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)z00;
                spatial_region::f_init_cos
                          (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                           in_stack_fffffffffffff3d0,
                           (double)CONCAT17(in_stack_fffffffffffff3cf,
                                            CONCAT16(in_stack_fffffffffffff3ce,
                                                     in_stack_fffffffffffff3c8)),
                           in_stack_fffffffffffff3c0,
                           (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                           in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                           (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                           in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,
                           in_stack_fffffffffffff3f8,(bool)uVar2,
                           (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                           in_stack_fffffffffffff408,
                           (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                           in_stack_fffffffffffff418);
                std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                          ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                           0x145e5d);
                std::operator==(pbVar182,pcVar181);
                std::operator==(pbVar182,pcVar181);
                dVar186 = dx;
                dVar183 = xlength * 0.5 - x0;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                auVar130._8_8_ = 0;
                auVar130._0_8_ = dVar183;
                auVar110._8_8_ = 0;
                auVar110._0_8_ = dVar186;
                auVar69._0_8_ = (double)*pvVar6;
                auVar69._8_8_ = uVar29;
                vfnmadd213sd_fma(auVar69,auVar110,auVar130);
                spatial_region::f_init_cos
                          (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                           in_stack_fffffffffffff3d0,
                           (double)CONCAT17(in_stack_fffffffffffff3cf,
                                            CONCAT16(in_stack_fffffffffffff3ce,
                                                     in_stack_fffffffffffff3c8)),
                           in_stack_fffffffffffff3c0,
                           (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                           in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                           (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                           in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,
                           in_stack_fffffffffffff3f8,(bool)uVar2,
                           (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                           in_stack_fffffffffffff408,
                           (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                           in_stack_fffffffffffff418);
              }
            }
            else {
              bVar1 = std::operator==(pbVar182,pcVar181);
              if (bVar1) {
                std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                          ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                           0x14609b);
                std::operator==(pbVar182,pcVar181);
                std::operator==(pbVar182,pcVar181);
                dVar186 = dx;
                dVar183 = xlength * 0.5 - x0;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_4);
                auVar131._8_8_ = 0;
                auVar131._0_8_ = dVar183;
                auVar111._8_8_ = 0;
                auVar111._0_8_ = dVar186;
                auVar70._0_8_ = (double)*pvVar6;
                auVar70._8_8_ = uVar29;
                vfnmadd213sd_fma(auVar70,auVar111,auVar131);
                spatial_region::f_init_cos
                          (in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                           in_stack_fffffffffffff3d0,
                           (double)CONCAT17(in_stack_fffffffffffff3cf,
                                            CONCAT16(in_stack_fffffffffffff3ce,
                                                     in_stack_fffffffffffff3c8)),
                           in_stack_fffffffffffff3c0,
                           (double)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
                           in_stack_fffffffffffff3b0,in_stack_fffffffffffff3ac,
                           (bool)in_stack_fffffffffffff3ab,in_stack_fffffffffffff3a0,
                           in_stack_fffffffffffff398,in_stack_fffffffffffff3f0,
                           in_stack_fffffffffffff3f8,(bool)uVar2,
                           (double)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                           in_stack_fffffffffffff408,
                           (double)CONCAT17(in_stack_fffffffffffff417,in_stack_fffffffffffff410),
                           in_stack_fffffffffffff418);
              }
            }
          }
        }
      }
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_178);
    }
  }
  return;
}

Assistant:

void init_fields()
{
    int i = mpi_rank;
    if (f_envelope=="focused")
    {
        const char* tmpl = lp_reflection.c_str();
        int lp_len = lp_reflection.size();
        const char* tmpf = f_reflection.c_str();
        int f_len = f_reflection.size();
        std::string lp_reflection1 = "";
        std::string lp_reflection2 = "";
        std::string lp_reflection3 = "";
        std::string f_reflection1 = "";
        std::string f_reflection2 = "";
        std::string f_reflection3 = "";
        int jj;
        for( jj=0;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
            lp_reflection1 += tmpl[jj];
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection2 += tmpl[jj];
            }
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection3 += tmpl[jj];
            }
        }
        for( jj=0;jj<f_len&&tmpf[jj]!='&';jj++ ) {
            f_reflection1 += tmpf[jj];
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection2 += tmpf[jj];
            }
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection3 += tmpf[jj];
            }
        }
        if (shenergy == 0) 
            psr->f_init_focused(a0y,a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,y00,z00,0,0,sscos,1,xtarget,ytarget,ztarget);
        else  // adding second harmonic
        {
            double alpha, beta;
            alpha = sqrt(1 - shenergy);
            beta = sqrt(shenergy);
            psr->f_init_focused(a0y * alpha, a0z * alpha, xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,y00,z00,0,0,sscos,1,xtarget,ytarget,ztarget);
            psr->f_init_focused(a0y * beta, a0z * beta, xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign, shphase,y00,z00, 1, 0,sscos, 2,xtarget,ytarget,ztarget);
        }
        if (phi!=0) {
            psr->f_init_focused(a0y,a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,-z00,1,phi,sscos,1,xtarget,ytarget,ztarget);
        }
        else if (lp_reflection1=="xy") {
            psr->f_init_focused((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
            if (lp_reflection2=="xz") {
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                if (lp_reflection3=="yz") {
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                }
            }
            else if (lp_reflection2=="yz") {
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                if (lp_reflection3=="xz") {
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                    psr->f_init_focused((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,-z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                }
            }
        }
        else if (lp_reflection1=="xz") {
            psr->f_init_focused((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,sigma0,xlength/2+x0-dx*x0_sr[i],x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
            if (lp_reflection2=="yz") {
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,-y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
                psr->f_init_focused((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
            }
        }
        else if (lp_reflection1=="yz") {
            psr->f_init_focused((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,sigma0,xlength/2-x0-dx*x0_sr[i],-x0,b_sign,phase,y00,z00,1,0,sscos,1,xtarget,ytarget,ztarget);
        }
    } else if (f_envelope == "uniformB") {
        psr->f_init_uniformB(a0y, a0z);
    }
    else // f_envelope == "cos"
    {
        if (f_envelope != "cos") {
            if (mpi_rank == 0) {
                cout << TERM_RED << "Unknown f_envelope value [" << f_envelope << "] during initialization"
                     << TERM_NO_COLOR << endl;
            }
        }
        const char* tmpl = lp_reflection.c_str();
        int lp_len = lp_reflection.size();
        const char* tmpf = f_reflection.c_str();
        int f_len = f_reflection.size();
        std::string lp_reflection1 = "";
        std::string lp_reflection2 = "";
        std::string lp_reflection3 = "";
        std::string f_reflection1 = "";
        std::string f_reflection2 = "";
        std::string f_reflection3 = "";
        int jj;
        for( jj=0;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
            lp_reflection1 += tmpl[jj];
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection2 += tmpl[jj];
            }
        }
        jj++;
        if(jj<lp_len) {
            for( ;jj<lp_len&&tmpl[jj]!='&';jj++ ) {
                lp_reflection3 += tmpl[jj];
            }
        }
        for( jj=0;jj<f_len&&tmpf[jj]!='&';jj++ ) {
            f_reflection1 += tmpf[jj];
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection2 += tmpf[jj];
            }
        }
        jj++;
        if(jj<f_len) {
            for( ;jj<f_len&&tmpf[jj]!='&';jj++ ) {
                f_reflection3 += tmpf[jj];
            }
        }

        if (phi_rotate != 0) {
            psr->f_init_cos(a0y,a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,y00,z00,1,phi_rotate,xtarget,ytarget,ztarget);
        } else {
            psr->f_init_cos(a0y,a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,y00,z00,true,0,xtarget,ytarget,ztarget);
            if (phi!=0) {
                psr->f_init_cos(a0y,a0z,xsigma,ysigma,zsigma,xlength/2-x0-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,-z00,1,phi,xtarget,ytarget,ztarget);
            }
            else if (lp_reflection1=="xy") {
                psr->f_init_cos((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,y00,-z00,1,0,xtarget,ytarget,ztarget);
                if (lp_reflection2=="xz") {
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                    if (lp_reflection3=="yz") {
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,-z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                    }
                }
                else if (lp_reflection2=="yz") {
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,-z00,1,0,xtarget,ytarget,ztarget);
                    if (lp_reflection3=="xz") {
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,x0+xlength/2-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                        psr->f_init_cos((1-2*(f_reflection3=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,x0+xlength/2-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,-z00,1,0,xtarget,ytarget,ztarget);
                    }
                }
            }
            else if (lp_reflection1=="xz") {
                psr->f_init_cos((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,ysigma,zsigma,xlength/2+x0-dx*x0_sr[i],sscos,b_sign,x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                if (lp_reflection2=="yz") {
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,-y00,z00,1,0,xtarget,ytarget,ztarget);
                    psr->f_init_cos((1-2*(f_reflection2=="y"))*a0y,(1-2*(f_reflection2=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
                }
            }
            else if (lp_reflection1=="yz") {
                psr->f_init_cos((1-2*(f_reflection1=="y"))*a0y,(1-2*(f_reflection1=="z"))*a0z,xsigma,ysigma,zsigma,-x0+xlength/2-dx*x0_sr[i],sscos,b_sign,-x0,phase,y00,z00,1,0,xtarget,ytarget,ztarget);
            }
        }
    }
}